

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_logs_test.cpp
# Opt level: O0

void __thiscall
metacall_logs_test_DefaultConstructor_Test::~metacall_logs_test_DefaultConstructor_Test
          (metacall_logs_test_DefaultConstructor_Test *this)

{
  void *in_RDI;
  
  ~metacall_logs_test_DefaultConstructor_Test
            ((metacall_logs_test_DefaultConstructor_Test *)0x10b048);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_F(metacall_logs_test, DefaultConstructor)
{
	metacall_log_stdio_type log_stdio = { stdout };

	metacall_print_info();

	for (int i = 0; i < 50; ++i)
	{
		ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));
	}

	ASSERT_EQ((int)0, (int)metacall_initialize());

	metacall_destroy();
}